

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

pair<hta::Metric_&,_bool> __thiscall
hta::Directory::emplace(Directory *this,string *name,json *config)

{
  type *this_00;
  type_conflict2 *__y;
  runtime_error *this_01;
  pointer ppVar1;
  undefined8 extraout_RDX;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>,_bool>
  pVar2;
  pair<hta::Metric_&,_bool> pVar3;
  type_conflict2 *inserted;
  type *it;
  Metric local_b0;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  lock_guard<hta::OptionalMutex> guard;
  json *config_local;
  string *name_local;
  Directory *this_local;
  bool local_10;
  
  guard._M_device = (mutex_type *)config;
  std::lock_guard<hta::OptionalMutex>::lock_guard
            ((lock_guard<hta::OptionalMutex> *)(local_40 + 8),&this->mutex_);
  std::forward_as_tuple<std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  make_metric(&local_b0,this,name,(json *)guard._M_device);
  std::forward_as_tuple<hta::Metric>((Metric *)&stack0xffffffffffffffa8);
  pVar2 = std::
          unordered_map<std::__cxx11::string,hta::Metric,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,hta::Metric>>>
          ::
          emplace<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<hta::Metric&&>>
                    ((unordered_map<std::__cxx11::string,hta::Metric,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,hta::Metric>>>
                      *)&this->metrics_,(piecewise_construct_t *)&std::piecewise_construct,
                     (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)local_50,(tuple<hta::Metric_&&> *)&stack0xffffffffffffffa8);
  local_50._8_8_ =
       pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
       ._M_cur;
  local_40[0] = pVar2.second;
  Metric::~Metric(&local_b0);
  this_00 = std::
            get<0ul,std::__detail::_Node_iterator<std::pair<std::__cxx11::string_const,hta::Metric>,false,true>,bool>
                      ((pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>,_bool>
                        *)(local_50 + 8));
  __y = std::
        get<1ul,std::__detail::_Node_iterator<std::pair<std::__cxx11::string_const,hta::Metric>,false,true>,bool>
                  ((pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>,_bool>
                    *)(local_50 + 8));
  if ((*__y & 1U) == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,
               "emplacing a metric that is already contained in a Directory is currently not supported"
              );
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVar1 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>
           ::operator->(this_00);
  std::pair<hta::Metric_&,_bool>::pair<bool_&,_true>
            ((pair<hta::Metric_&,_bool> *)&this_local,&ppVar1->second,__y);
  std::lock_guard<hta::OptionalMutex>::~lock_guard((lock_guard<hta::OptionalMutex> *)(local_40 + 8))
  ;
  pVar3._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar3.second = local_10;
  pVar3.first = (Metric *)this_local;
  return pVar3;
}

Assistant:

std::pair<Metric&, bool> Directory::emplace(const std::string& name, const json& config)
{
    std::lock_guard<OptionalMutex> guard(mutex_);

    auto [it, inserted] = metrics_.emplace(std::piecewise_construct, std::forward_as_tuple(name),
                                           std::forward_as_tuple(make_metric(name, config)));
    (void)it;
    if (!inserted)
    {
        throw std::runtime_error("emplacing a metric that is already contained in a Directory "
                                 "is currently not supported");
    }
    return { it->second, inserted };
}